

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

void __thiscall
cs_impl::cni_helper<void_(*)(bool),_void_(*)(bool)>::_call<0>
          (cni_helper<void_(*)(bool),_void_(*)(bool)> *this,vector *args,sequence<0> *param_2)

{
  bool local_9;
  
  local_9 = try_convert_and_check<bool,_bool,_bool,_0UL>::convert
                      ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  if ((this->mFunc).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->mFunc)._M_invoker)((_Any_data *)this,&local_9);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...);
		}